

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall ami_nvar_t::nvar_attributes_t::_read(nvar_attributes_t *this)

{
  uint64_t uVar1;
  nvar_attributes_t *this_local;
  
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_valid = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_auth_write = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_hw_error_record = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_extended_header = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_data_only = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_local_guid = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_ascii_name = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_be((this->super_kstruct).m__io,1);
  this->m_runtime = uVar1 != 0;
  return;
}

Assistant:

void ami_nvar_t::nvar_attributes_t::_read() {
    m_valid = m__io->read_bits_int_be(1);
    m_auth_write = m__io->read_bits_int_be(1);
    m_hw_error_record = m__io->read_bits_int_be(1);
    m_extended_header = m__io->read_bits_int_be(1);
    m_data_only = m__io->read_bits_int_be(1);
    m_local_guid = m__io->read_bits_int_be(1);
    m_ascii_name = m__io->read_bits_int_be(1);
    m_runtime = m__io->read_bits_int_be(1);
}